

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SegReaderStart(Fts3Table *p,Fts3MultiSegReader *pCsr,char *zTerm,int nTerm)

{
  int nSegment;
  Fts3SegReader *pReader;
  int iVar1;
  bool bVar2;
  int rc;
  Fts3SegReader *pSeg;
  int res;
  int nSeg;
  int i;
  int nTerm_local;
  char *zTerm_local;
  Fts3MultiSegReader *pCsr_local;
  Fts3Table *p_local;
  
  nSegment = pCsr->nSegment;
  res = 0;
  while( true ) {
    bVar2 = false;
    if (pCsr->bRestart == 0) {
      bVar2 = res < pCsr->nSegment;
    }
    if (!bVar2) break;
    pSeg._0_4_ = 0;
    pReader = pCsr->apSegment[res];
    do {
      iVar1 = fts3SegReaderNext(p,pReader,0);
      if (iVar1 != 0) {
        return iVar1;
      }
      bVar2 = false;
      if (zTerm != (char *)0x0) {
        pSeg._0_4_ = fts3SegReaderTermCmp(pReader,zTerm,nTerm);
        bVar2 = (int)pSeg < 0;
      }
    } while (bVar2);
    if ((pReader->bLookup != '\0') && ((int)pSeg != 0)) {
      fts3SegReaderSetEof(pReader);
    }
    res = res + 1;
  }
  fts3SegReaderSort(pCsr->apSegment,nSegment,nSegment,fts3SegReaderCmp);
  return 0;
}

Assistant:

static int fts3SegReaderStart(
  Fts3Table *p,                   /* Virtual table handle */
  Fts3MultiSegReader *pCsr,       /* Cursor object */
  const char *zTerm,              /* Term searched for (or NULL) */
  int nTerm                       /* Length of zTerm in bytes */
){
  int i;
  int nSeg = pCsr->nSegment;

  /* If the Fts3SegFilter defines a specific term (or term prefix) to search 
  ** for, then advance each segment iterator until it points to a term of
  ** equal or greater value than the specified term. This prevents many
  ** unnecessary merge/sort operations for the case where single segment
  ** b-tree leaf nodes contain more than one term.
  */
  for(i=0; pCsr->bRestart==0 && i<pCsr->nSegment; i++){
    int res = 0;
    Fts3SegReader *pSeg = pCsr->apSegment[i];
    do {
      int rc = fts3SegReaderNext(p, pSeg, 0);
      if( rc!=SQLITE_OK ) return rc;
    }while( zTerm && (res = fts3SegReaderTermCmp(pSeg, zTerm, nTerm))<0 );

    if( pSeg->bLookup && res!=0 ){
      fts3SegReaderSetEof(pSeg);
    }
  }
  fts3SegReaderSort(pCsr->apSegment, nSeg, nSeg, fts3SegReaderCmp);

  return SQLITE_OK;
}